

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

float ImGui::TableGetHeaderRowHeight(void)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  char *text;
  ImGuiStyle *pIVar6;
  int column_n;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar7 [64];
  int iVar8;
  undefined1 local_28 [16];
  undefined1 extraout_var [56];
  
  local_28._0_4_ = GetTextLineHeight();
  local_28._4_4_ = extraout_XMM0_Db;
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._12_4_ = extraout_XMM0_Dd;
  if ((GImGui->CurrentTable != (ImGuiTable *)0x0) &&
     (iVar1 = GImGui->CurrentTable->ColumnsCount, 0 < iVar1)) {
    column_n = 0;
    do {
      uVar5 = TableGetColumnFlags(column_n);
      if ((uVar5 & 0x1001000) == 0x1000000) {
        text = TableGetColumnName(column_n);
        auVar7._0_8_ = CalcTextSize(text,(char *)0x0,false,-1.0);
        auVar7._8_56_ = extraout_var;
        auVar2 = vmovshdup_avx(auVar7._0_16_);
        uVar3 = vcmpss_avx512f(auVar2,local_28,2);
        bVar4 = (bool)((byte)uVar3 & 1);
        iVar8 = local_28._0_4_;
        local_28._4_12_ = auVar2._4_12_;
        local_28._0_4_ = (uint)bVar4 * iVar8 + (uint)!bVar4 * auVar2._0_4_;
      }
      column_n = column_n + 1;
    } while (iVar1 != column_n);
  }
  pIVar6 = GetStyle();
  auVar2 = vfmadd132ss_fma(ZEXT416((uint)(pIVar6->CellPadding).y),local_28,ZEXT416(0x40000000));
  return auVar2._0_4_;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    float row_height = GetTextLineHeight();
    int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        ImGuiTableColumnFlags flags = TableGetColumnFlags(column_n);
        if ((flags & ImGuiTableColumnFlags_IsEnabled) && !(flags & ImGuiTableColumnFlags_NoHeaderLabel))
            row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(column_n)).y);
    }
    row_height += GetStyle().CellPadding.y * 2.0f;
    return row_height;
}